

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Specs.hpp
# Opt level: O2

ostream * sciplot::operator<<(ostream *stream,Specs<sciplot::FillStyleSpecs> *obj)

{
  ostream *poVar1;
  string local_30 [32];
  
  (*obj->_vptr_Specs[2])(local_30);
  poVar1 = std::operator<<(stream,local_30);
  std::__cxx11::string::~string(local_30);
  return poVar1;
}

Assistant:

auto operator<<(std::ostream& stream, const Specs<DerivedSpecs>& obj) -> std::ostream&
{
    return stream << obj.repr();
}